

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  byte bVar2;
  CodedInputStream input;
  CodedInputStream local_58;
  
  local_58.input_ = (ZeroCopyInputStream *)0x0;
  local_58.buffer_end_ = (uint8 *)((long)data + (long)size);
  local_58.overflow_bytes_ = 0;
  local_58.last_tag_ = 0;
  local_58.legitimate_message_end_ = false;
  local_58.aliasing_enabled_ = false;
  local_58.buffer_size_after_limit_ = 0;
  local_58.total_bytes_limit_ = 0x4000000;
  local_58.total_bytes_warning_threshold_ = 0x2000000;
  local_58.recursion_depth_ = 0;
  local_58.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_58.extension_pool_ = (DescriptorPool *)0x0;
  local_58.extension_factory_ = (MessageFactory *)0x0;
  local_58.buffer_ = (uint8 *)data;
  local_58.total_bytes_read_ = size;
  local_58.current_limit_ = size;
  (*this->_vptr_MessageLite[4])();
  iVar1 = (*this->_vptr_MessageLite[8])(this,&local_58);
  bVar2 = (byte)iVar1 & local_58.legitimate_message_end_;
  io::CodedInputStream::~CodedInputStream(&local_58);
  return (bool)bVar2;
}

Assistant:

bool MessageLite::ParsePartialFromArray(const void* data, int size) {
  return InlineParsePartialFromArray(data, size, this);
}